

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O3

void __thiscall Js::DebugManager::UnsetCurrentInterpreterLocation(DebugManager *this)

{
  LONG *pLVar1;
  ReferencedArenaAdapter *pRVar2;
  Recycler *this_00;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  InterpreterHaltState *pIVar6;
  ArenaAllocator *pAVar7;
  ArenaData *local_20;
  
  pIVar6 = this->pCurrentInterpreterLocation;
  if (pIVar6 == (InterpreterHaltState *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                ,0x65,"(pCurrentInterpreterLocation)","pCurrentInterpreterLocation")
    ;
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    pIVar6 = this->pCurrentInterpreterLocation;
    if (pIVar6 == (InterpreterHaltState *)0x0) {
      return;
    }
  }
  pRVar2 = pIVar6->referencedDiagnosticArena;
  if (pRVar2 != (ReferencedArenaAdapter *)0x0) {
    this_00 = this->pThreadContext->recycler;
    if (pRVar2->deleteFlag == false) {
      pAVar7 = pRVar2->arena;
    }
    else {
      pAVar7 = (ArenaAllocator *)0x0;
    }
    local_20 = &(pAVar7->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
                super_ArenaData;
    if (pAVar7 == (ArenaAllocator *)0x0) {
      local_20 = (ArenaData *)0x0;
    }
    DListBase<Memory::ArenaData_*,_RealCount>::Remove<Memory::NoThrowHeapAllocator>
              (&this_00->externalGuestArenaList,
               (NoThrowHeapAllocator *)&Memory::NoThrowHeapAllocator::Instance,&local_20);
    Memory::Recycler::CollectNow<(Memory::CollectionFlags)8320>(this_00);
    Memory::ReferencedArenaAdapter::DeleteArena
              (this->pCurrentInterpreterLocation->referencedDiagnosticArena);
    pRVar2 = this->pCurrentInterpreterLocation->referencedDiagnosticArena;
    LOCK();
    pLVar1 = &(pRVar2->super_RefCounted).refCount;
    *pLVar1 = *pLVar1 + -1;
    UNLOCK();
    if (*pLVar1 == 0) {
      (*(pRVar2->super_RefCounted)._vptr_RefCounted[1])();
    }
  }
  this->pCurrentInterpreterLocation = (InterpreterHaltState *)0x0;
  return;
}

Assistant:

void DebugManager::UnsetCurrentInterpreterLocation()
    {
        Assert(pCurrentInterpreterLocation);

        if (pCurrentInterpreterLocation)
        {
            // pCurrentInterpreterLocation->referencedDiagnosticArena could be null if we ran out of memory during SetCurrentInterpreterLocation
            if (pCurrentInterpreterLocation->referencedDiagnosticArena)
            {
                pThreadContext->GetRecycler()->UnregisterExternalGuestArena(pCurrentInterpreterLocation->referencedDiagnosticArena->Arena());
                pCurrentInterpreterLocation->referencedDiagnosticArena->DeleteArena();
                pCurrentInterpreterLocation->referencedDiagnosticArena->Release();
            }

            pCurrentInterpreterLocation = nullptr;
        }
    }